

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::operationToName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Operation *operations,
          bool useBranch)

{
  uint uVar1;
  bool bVar2;
  ostringstream stream;
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  uVar1 = *(uint *)this;
  bVar2 = (uVar1 & 4) == 0;
  if (!bVar2) {
    std::operator<<(&local_190,"get");
    uVar1 = *(uint *)this;
  }
  if ((uVar1 & 1) != 0) {
    if (!bVar2) {
      std::operator<<(&local_190,"_");
    }
    std::operator<<(&local_190,"inc");
    uVar1 = *(uint *)this;
    bVar2 = false;
  }
  if ((uVar1 & 2) != 0) {
    if (!bVar2) {
      std::operator<<(&local_190,"_");
    }
    std::operator<<(&local_190,"dec");
  }
  if ((char)operations != '\0') {
    std::operator<<(&local_190,"_branch");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

string operationToName (const AtomicCounterTest::Operation& operations, bool useBranch)
{
	std::ostringstream	stream;
	bool				first = true;

	if ((operations & AtomicCounterTest::OPERATION_GET) != 0)
	{
		stream << "get";
		first = false;
	}

	if ((operations & AtomicCounterTest::OPERATION_INC) != 0)
	{
		if (!first)
			stream << "_";

		stream << "inc";
		first = false;
	}

	if ((operations & AtomicCounterTest::OPERATION_DEC) != 0)
	{
		if (!first)
			stream << "_";

		stream << "dec";
		first = false;
	}

	if (useBranch)
		stream << "_branch";

	return stream.str();
}